

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capture_fuzz.cpp
# Opt level: O2

bool __thiscall capture_fuzz::FuzzPacket(capture_fuzz *this,uint8_t *packet,size_t packet_length)

{
  uint64_t uVar1;
  uint8_t *__dest;
  ulong uVar2;
  size_t new_size;
  size_t i;
  ulong uVar3;
  
  uVar1 = picoquic_test_random(&this->fuzz_random_context);
  if (7 < packet_length) {
    if (this->buffer_size < packet_length) {
      __dest = (uint8_t *)operator_new__(packet_length);
      if (this->buffer != (uint8_t *)0x0) {
        operator_delete__(this->buffer);
      }
      this->buffer = __dest;
      this->buffer_size = packet_length;
    }
    else {
      __dest = this->buffer;
    }
    memcpy(__dest,packet,packet_length);
    uVar2 = picoquic_test_random(&this->fuzz_random_context);
    for (uVar3 = 0;
        (uVar3 <= ((uint)(uVar1 >> 0x11) & 7) && (uVar3 + uVar1 % packet_length < packet_length));
        uVar3 = uVar3 + 1) {
      packet[uVar3] = (uint8_t)uVar2;
      uVar2 = uVar2 >> 8;
    }
    this->fuzzed_length = packet_length;
  }
  return 7 < packet_length;
}

Assistant:

bool capture_fuzz::FuzzPacket(uint8_t * packet, size_t packet_length)
{
    bool ret = true;
    uint64_t random_pilot = picoquic_test_random(&fuzz_random_context);

    if (packet_length < 8) {
        return false;
    }

    /* Reallocate the capture buffer */
    if (packet_length > buffer_size)
    {
        size_t new_size = packet_length;
        uint8_t * new_buf = new uint8_t[packet_length];
        if (new_buf == NULL)
        {
            ret = false;
        }
        else
        {
            if (buffer != NULL)
            {
                delete[] buffer;
            }
            buffer = new_buf;
            buffer_size = new_size;
        }
    }

    if (ret) {
        /* smash some random location in the packet */
        size_t x = random_pilot % packet_length;
        size_t y = (size_t)((random_pilot >> 17) & 0x07) + 1;

        memcpy(buffer, packet, packet_length);

        random_pilot = picoquic_test_random(&fuzz_random_context);
        for (size_t i = 0; i < y && x + i < packet_length; i++) {
            packet[i] = (uint8_t)(random_pilot & 0xFF);
            random_pilot >>= 8;
        }

        fuzzed_length = packet_length;
    }

    return ret;
}